

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O3

decNumber_conflict * decTrim(decNumber_conflict *dn,decContext *set,uint8_t all,int32_t *dropped)

{
  int shift;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint16_t *puVar5;
  int iVar6;
  bool bVar7;
  
  *dropped = 0;
  if (((dn->bits & 0x70) == 0) && ((dn->lsu[0] & 1) == 0)) {
    uVar2 = dn->digits;
    if (uVar2 == 1 && dn->lsu[0] == 0) {
      dn->exponent = 0;
    }
    else if (1 < (int)uVar2) {
      shift = uVar2 - 1;
      iVar4 = 0;
      uVar1 = 1;
      puVar5 = dn->lsu;
      iVar6 = dn->exponent;
      do {
        if ((ulong)((uint)(*puVar5 >> ((byte)uVar1 & 0x1f)) * multies[uVar1] >> 0x11) *
            DECPOWERS[uVar1] - (ulong)*puVar5 != 0) {
LAB_00b1ba0a:
          if (iVar4 == 0) {
            return dn;
          }
          shift = -iVar4;
          break;
        }
        if (iVar6 < 1 && all == '\0') {
          if (iVar6 == 0) goto LAB_00b1ba0a;
          iVar6 = iVar6 + 1;
        }
        bVar7 = 2 < uVar1;
        uVar1 = uVar1 + 1;
        if (bVar7) {
          uVar1 = 1;
        }
        puVar5 = puVar5 + bVar7;
        iVar3 = uVar2 + iVar4;
        iVar4 = iVar4 + -1;
      } while (iVar3 != 2);
      if (set->clamp != '\0') {
        iVar6 = (set->emax - (dn->exponent + set->digits)) + 1;
        if (iVar6 <= shift) {
          shift = iVar6;
        }
        if (iVar6 < 1) {
          return dn;
        }
      }
      if ((int)uVar2 < 0x32) {
        uVar2 = (uint)""[uVar2];
      }
      else {
        uVar2 = (uVar2 + 2) / 3;
      }
      decShiftToLeast(dn->lsu,uVar2,shift);
      dn->exponent = dn->exponent + shift;
      dn->digits = dn->digits - shift;
      *dropped = shift;
    }
  }
  return dn;
}

Assistant:

static decNumber * decTrim(decNumber *dn, decContext *set, Flag all,
			   Int *dropped) {
  Int	d, exp;			   /* work */
  uInt	cut;			   /* .. */
  Unit	*up;			   /* -> current Unit */

  #if DECCHECK
  if (decCheckOperands(dn, DECUNUSED, DECUNUSED, DECUNCONT)) return dn;
  #endif

  *dropped=0;				/* assume no zeros dropped */
  if ((dn->bits & DECSPECIAL)		/* fast exit if special .. */
    || (*dn->lsu & 0x01)) return dn;	/* .. or odd */
  if (ISZERO(dn)) {			/* .. or 0 */
    dn->exponent=0;			/* (sign is preserved) */
    return dn;
    }

  /* have a finite number which is even */
  exp=dn->exponent;
  cut=1;			   /* digit (1-DECDPUN) in Unit */
  up=dn->lsu;			   /* -> current Unit */
  for (d=0; d<dn->digits-1; d++) { /* [don't strip the final digit] */
    /* slice by powers */
    #if DECDPUN<=4
      uInt quot=QUOT10(*up, cut);
      if ((*up-quot*powers[cut])!=0) break;  /* found non-0 digit */
    #else
      if (*up%powers[cut]!=0) break;	     /* found non-0 digit */
    #endif
    /* have a trailing 0 */
    if (!all) {			   /* trimming */
      /* [if exp>0 then all trailing 0s are significant for trim] */
      if (exp<=0) {		   /* if digit might be significant */
	if (exp==0) break;	   /* then quit */
	exp++;			   /* next digit might be significant */
	}
      }
    cut++;			   /* next power */
    if (cut>DECDPUN) {		   /* need new Unit */
      up++;
      cut=1;
      }
    } /* d */
  if (d==0) return dn;		   /* none to drop */

  /* may need to limit drop if clamping */
  if (set->clamp) {
    Int maxd=set->emax-set->digits+1-dn->exponent;
    if (maxd<=0) return dn;	   /* nothing possible */
    if (d>maxd) d=maxd;
    }

  /* effect the drop */
  decShiftToLeast(dn->lsu, D2U(dn->digits), d);
  dn->exponent+=d;		   /* maintain numerical value */
  dn->digits-=d;		   /* new length */
  *dropped=d;			   /* report the count */
  return dn;
  }